

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::
format<std::__cxx11::string,std::__cxx11::string,long,int,std::__cxx11::string,std::__cxx11::string,long,int>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,long *args_2,
          int *args_3,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,long *args_6,
          int *args_7)

{
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  format<std::__cxx11::string,std::__cxx11::string,long,int,std::__cxx11::string,std::__cxx11::string,long,int>
            ((ostream *)local_1b0,(char *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,args,
             (long *)args_1,(int *)args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3,args_4,
             (long *)args_5,(int *)args_6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}